

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MakeVerboseFormat.cpp
# Opt level: O1

void __thiscall
Assimp::MakeVerboseFormatProcess::Execute(MakeVerboseFormatProcess *this,aiScene *pScene)

{
  bool bVar1;
  Logger *pLVar2;
  ulong uVar3;
  bool bVar4;
  
  if (pScene == (aiScene *)0x0) {
    __assert_fail("__null != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/MakeVerboseFormat.cpp"
                  ,0x43,"virtual void Assimp::MakeVerboseFormatProcess::Execute(aiScene *)");
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"MakeVerboseFormatProcess begin");
  if (pScene->mNumMeshes != 0) {
    uVar3 = 0;
    bVar4 = false;
    do {
      bVar1 = MakeVerboseFormat((MakeVerboseFormatProcess *)pLVar2,pScene->mMeshes[uVar3]);
      if (bVar1) {
        bVar4 = true;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < pScene->mNumMeshes);
    if (bVar4) {
      pLVar2 = DefaultLogger::get();
      Logger::info(pLVar2,"MakeVerboseFormatProcess finished. There was much work to do ...");
      goto LAB_00306f04;
    }
  }
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"MakeVerboseFormatProcess. There was nothing to do.");
LAB_00306f04:
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags & 0xf7;
  return;
}

Assistant:

void MakeVerboseFormatProcess::Execute( aiScene* pScene)
{
    ai_assert(NULL != pScene);
    ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess begin");

    bool bHas = false;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
    {
        if( MakeVerboseFormat( pScene->mMeshes[a]))
            bHas = true;
    }
    if (bHas) {
        ASSIMP_LOG_INFO("MakeVerboseFormatProcess finished. There was much work to do ...");
    } else {
        ASSIMP_LOG_DEBUG("MakeVerboseFormatProcess. There was nothing to do.");
    }

    pScene->mFlags &= ~AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
}